

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O0

VectorU __thiscall anurbs::HilbertCurve<2L>::point_at(HilbertCurve<2L> *this,size_t m,size_t h)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  Scalar *pSVar4;
  unsigned_long extraout_RDX;
  unsigned_long uVar5;
  unsigned_long extraout_RDX_00;
  VectorU VVar6;
  size_t local_68;
  Index j_1;
  size_t l;
  Index j;
  size_t w;
  Index i;
  ulong local_30;
  size_t vd;
  size_t ve;
  size_t h_local;
  size_t m_local;
  VectorU *p;
  
  vd = 0;
  local_30 = 0;
  ve = h;
  h_local = m;
  m_local = (size_t)this;
  Eigen::DenseBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::Matrix<unsigned_long,1,2,1,1,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,Eigen::Matrix<unsigned_long,1,2,1,1,2>>>
            ((Matrix<unsigned_long,1,2,1,1,2> *)this,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>_>
              *)&i);
  uVar5 = extraout_RDX;
  w = h_local;
  while (w = w - 1, -1 < (long)w) {
    j = 0;
    for (l = 0; sVar2 = vd, uVar1 = local_30, (long)l < 2; l = l + 1) {
      sVar2 = bit(ve,w * 2 + l);
      j = (sVar2 << ((byte)l & 0x3f)) + j;
    }
    sVar3 = gc(j);
    sVar2 = inverse_t(sVar2,uVar1,sVar3);
    for (local_68 = 0; sVar3 = vd, (long)local_68 < 2; local_68 = local_68 + 1) {
      sVar3 = bit(sVar2,local_68);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)this,
                          local_68);
      *pSVar4 = (sVar3 << ((byte)w & 0x3f)) + *pSVar4;
    }
    sVar2 = e(j);
    sVar2 = rol(sVar2,local_30 + 1);
    uVar1 = local_30;
    vd = sVar3 ^ sVar2;
    sVar2 = d(j);
    local_30 = uVar1 + sVar2 + 1 & 1;
    uVar5 = extraout_RDX_00;
  }
  VVar6.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
  [1] = uVar5;
  VVar6.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.array
  [0] = (unsigned_long)this;
  return (VectorU)VVar6.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.
                  m_storage.m_data.array;
}

Assistant:

static VectorU point_at(const size_t m, const size_t h) noexcept
    {
        // FIXME: check m

        size_t ve = 0;
        size_t vd = 0;

        VectorU p = VectorU::Zero();

        for (Index i = m - 1; i > -1; i--) {
            size_t w = 0;

            for (Index j = 0; j < TDimension; j++) {
                w += bit(h, i * TDimension + j) << j;
            }

            const size_t l = inverse_t(ve, vd, gc(w));

            for (Index j = 0; j < TDimension; j++) {
                p[j] += bit(l, j) << i;
            }

            ve = ve ^ rol(e(w), vd + 1);
            vd = (vd + d(w) + 1) % TDimension;
        }

        return p;
    }